

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack25_32(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined4 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  auVar10 = *(undefined1 (*) [32])(in + 1);
  auVar11 = vpmovsxbd_avx512f(_DAT_0019db60);
  uVar2 = *in;
  auVar9 = *(undefined1 (*) [16])(in + 9);
  auVar17 = vpsllvd_avx2(auVar10,_DAT_0019a660);
  auVar5 = vpsllvd_avx2(auVar9,_DAT_0019daa0);
  auVar17 = vpand_avx2(auVar17,_DAT_0019a680);
  auVar5 = vpand_avx(auVar5,_DAT_0019dab0);
  *out = uVar2 & 0x1ffffff;
  uVar3 = in[0xd];
  auVar11 = vpermi2d_avx512f(auVar11,ZEXT3264(auVar10),ZEXT464(uVar2));
  auVar12 = vpmovsxbd_avx512f(_DAT_0019db70);
  auVar11 = vpermi2d_avx512f(auVar12,auVar11,ZEXT1664(auVar9));
  auVar12 = vpmovsxbd_avx512f(_DAT_0019db80);
  auVar11 = vpsrlvd_avx512f(auVar11,_DAT_001afc80);
  auVar13 = vpbroadcastd_avx512f(ZEXT416(0x1ffffff));
  auVar10 = vpmovsxbd_avx2(ZEXT816(0x3030201000008));
  auVar12 = vpermi2d_avx512f(auVar12,ZEXT3264(auVar17),ZEXT1664(auVar5));
  auVar14 = vpbroadcastd_avx512f();
  auVar14._0_60_ = auVar12._0_60_;
  auVar12 = vpord_avx512f(auVar11,auVar14);
  uVar1 = *(ulong *)(in + 0x12);
  uVar2 = in[0x14];
  auVar11 = vpandd_avx512f(auVar11,auVar13);
  auVar15._0_12_ = auVar12._0_12_;
  auVar15._12_4_ = auVar11._12_4_;
  auVar15._16_4_ = auVar12._16_4_;
  auVar15._20_4_ = auVar12._20_4_;
  auVar15._24_4_ = auVar12._24_4_;
  auVar15._28_4_ = auVar12._28_4_;
  auVar15._32_4_ = auVar11._32_4_;
  auVar15._36_4_ = auVar12._36_4_;
  auVar15._40_4_ = auVar12._40_4_;
  auVar15._44_4_ = auVar12._44_4_;
  auVar15._48_4_ = auVar11._48_4_;
  auVar15._52_4_ = auVar12._52_4_;
  auVar15._56_4_ = auVar12._56_4_;
  auVar15._60_4_ = auVar12._60_4_;
  auVar9 = *(undefined1 (*) [16])(in + 0xe);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar1;
  auVar5 = vpsllvd_avx2(auVar20,_DAT_0019dae0);
  auVar11 = vmovdqu64_avx512f(auVar15);
  *(undefined1 (*) [64])(out + 1) = auVar11;
  auVar8 = vpsllvd_avx2(auVar9,_DAT_0019dac0);
  auVar7._8_8_ = 0x1ffff0001fffffe;
  auVar7._0_8_ = 0x1ffff0001fffffe;
  auVar7 = vpandq_avx512vl(auVar5,auVar7);
  auVar5 = vpand_avx(auVar8,_DAT_0019dad0);
  auVar10 = vpermi2d_avx512vl(auVar10,ZEXT1632(auVar9),ZEXT432(uVar3));
  uVar19 = (undefined4)uVar1;
  auVar17._4_4_ = uVar19;
  auVar17._0_4_ = uVar19;
  auVar17._8_4_ = uVar19;
  auVar17._12_4_ = uVar19;
  auVar17._16_4_ = uVar19;
  auVar17._20_4_ = uVar19;
  auVar17._24_4_ = uVar19;
  auVar17._28_4_ = uVar19;
  uVar1 = *(ulong *)(in + 0x15);
  auVar9 = vshufps_avx(auVar5,auVar7,0x47);
  auVar5 = vshufps_avx(auVar5,auVar5,0x94);
  auVar18._16_16_ = auVar9;
  auVar18._0_16_ = auVar5;
  auVar10 = vpblendd_avx2(auVar10,auVar17,0x80);
  auVar10 = vpsrlvd_avx2(auVar10,_DAT_0019a6c0);
  auVar17 = vpor_avx2(auVar10,auVar18);
  auVar10 = vpand_avx2(auVar10,auVar13._0_32_);
  auVar10 = vpblendd_avx2(auVar17,auVar10,0x22);
  *(undefined1 (*) [32])(out + 0x11) = auVar10;
  auVar9 = vpshufd_avx(auVar20,0x55);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar1;
  auVar5 = vpsllvd_avx2(auVar21,_DAT_0019db00);
  auVar9 = vpinsrd_avx(auVar9,uVar2,1);
  auVar8._8_8_ = 0x1fffff001c00000;
  auVar8._0_8_ = 0x1fffff001c00000;
  auVar8 = vpandq_avx512vl(auVar5,auVar8);
  auVar9 = vshufps_avx(auVar9,auVar21,4);
  auVar5 = vpsrlvd_avx2(auVar9,_DAT_0019db20);
  auVar9 = vpinsrd_avx(auVar13._0_16_,(uVar2 & 0x3ff) << 0xf,0);
  uVar4 = *(ulong *)(in + 0x17);
  auVar9 = vpunpckldq_avx(auVar9,auVar8);
  auVar8 = vpor_avx(auVar5,auVar9);
  auVar9 = vpand_avx(auVar5,auVar13._0_16_);
  auVar5 = vpmovsxbd_avx(ZEXT416(0x401));
  auVar9 = vpblendd_avx2(auVar8,auVar9,4);
  *(undefined1 (*) [16])(out + 0x19) = auVar9;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar4;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9 = vpermi2d_avx512vl(auVar5,auVar9,auVar16);
  auVar5 = vpsrlvd_avx2(auVar9,_DAT_0019db40);
  auVar9 = vpsllvd_avx2(auVar16,_DAT_0019d470);
  auVar6._8_8_ = 0x1fc000001fff800;
  auVar6._0_8_ = 0x1fc000001fff800;
  auVar9 = vpternlogq_avx512vl(auVar9,auVar5,auVar6,0xec);
  *(long *)(out + 0x1d) = auVar9._0_8_;
  out[0x1f] = (uint)(uVar4 >> 0x27);
  return in + 0x19;
}

Assistant:

const uint32_t *__fastunpack25_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 18)) << (25 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 11)) << (25 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 4)) << (25 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 25);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 22)) << (25 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 15)) << (25 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 8)) << (25 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 1)) << (25 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 25);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 19)) << (25 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 12)) << (25 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 5)) << (25 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 25);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 23)) << (25 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 16)) << (25 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 9)) << (25 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 2)) << (25 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 25);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 20)) << (25 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 13)) << (25 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 6)) << (25 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 25);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 24)) << (25 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 17)) << (25 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 10)) << (25 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 3)) << (25 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 25);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 21)) << (25 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 14)) << (25 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 7)) << (25 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  out++;

  return in;
}